

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  IO_INTERFACE_DESCRIPTION *io_interface_description;
  XIO_HANDLE xio;
  TLSIO_CONFIG tlsio_config;
  char *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  iVar1 = platform_init();
  if (iVar1 == 0) {
    io_interface_description = platform_get_default_tlsio();
    if (io_interface_description == (IO_INTERFACE_DESCRIPTION *)0x0) {
      printf("Error getting tlsio interface description.");
      iVar1 = 0x45;
    }
    else {
      local_18 = 0;
      local_28 = 0;
      uStack_20 = 0;
      local_38 = "www.google.com";
      uStack_30 = 0x1bb;
      xio = xio_create(io_interface_description,&local_38);
      if (xio == (XIO_HANDLE)0x0) {
        printf("Error creating TLS IO.");
        iVar1 = 0x50;
      }
      else {
        iVar1 = xio_open(xio,on_io_open_complete,xio,on_io_bytes_received,xio,on_io_error,xio);
        if (iVar1 == 0) {
          do {
            xio_dowork(xio);
          } while( true );
        }
        printf("Error opening TLS IO.");
        xio_destroy(xio);
        iVar1 = 0x57;
      }
    }
    platform_deinit();
  }
  else {
    printf("Cannot initialize platform.");
    iVar1 = 0x3d;
  }
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
    int result;

    (void)argc, (void)argv;

    if (platform_init() != 0)
    {
        (void)printf("Cannot initialize platform.");
        result = MU_FAILURE;
    }
    else
    {
        const IO_INTERFACE_DESCRIPTION* tlsio_interface = platform_get_default_tlsio();
        if (tlsio_interface == NULL)
        {
            (void)printf("Error getting tlsio interface description.");
            result = MU_FAILURE;
        }
        else
        {
            TLSIO_CONFIG tlsio_config = { "www.google.com", 443, NULL, NULL};
            XIO_HANDLE tlsio;

            tlsio = xio_create(tlsio_interface, &tlsio_config);
            if (tlsio == NULL)
            {
                (void)printf("Error creating TLS IO.");
                result = MU_FAILURE;
            }
            else
            {
                if (xio_open(tlsio, on_io_open_complete, tlsio, on_io_bytes_received, tlsio, on_io_error, tlsio) != 0)
                {
                    (void)printf("Error opening TLS IO.");
                    result = MU_FAILURE;
                }
                else
                {
                    unsigned char done = 0;
                    while (!done)
                    {
                        xio_dowork(tlsio);
                    }

                    result = 0;
                }

                xio_destroy(tlsio);
            }
        }

        platform_deinit();
    }

    return result;
}